

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

int Lpk_FunComputeMinSuppSizeVar
              (Lpk_Fun_t *p,uint **ppTruths,int nTruths,uint **ppCofs,uint uNonDecSupp)

{
  uint uVar1;
  uint uVar2;
  uint iVar;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint local_8c;
  uint local_88;
  uint local_84;
  
  if (0 < nTruths) {
    local_8c = 0xffffffff;
    local_88 = local_8c;
    local_84 = local_8c;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      iVar = (uint)lVar3;
      if (((uNonDecSupp >> (iVar & 0x1f) & 1) != 0) && ((1 << ((byte)lVar3 & 0x1f) & p->uSupp) != 0)
         ) {
        lVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
        while( true ) {
          if ((ulong)(uint)nTruths * 8 == lVar4) break;
          if (nTruths == 1) {
            uVar1 = Kit_WordCountOnes(p->puSupps[lVar3 * 2]);
            uVar2 = Kit_WordCountOnes(p->puSupps[lVar3 * 2 + 1]);
          }
          else {
            Kit_TruthCofactor0New
                      (*(uint **)((long)ppCofs + lVar4 * 2),*(uint **)((long)ppTruths + lVar4),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            Kit_TruthCofactor1New
                      (*(uint **)((long)ppCofs + lVar4 * 2 + 8),*(uint **)((long)ppTruths + lVar4),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            uVar1 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar4 * 2),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
            uVar2 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar4 * 2 + 8),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
          }
          if ((int)uVar6 <= (int)uVar1) {
            uVar6 = uVar1;
          }
          if ((int)uVar6 <= (int)uVar2) {
            uVar6 = uVar2;
          }
          uVar5 = uVar5 + uVar1 + uVar2;
          lVar4 = lVar4 + 8;
        }
        if (((local_8c == 0xffffffff) || ((int)uVar6 < (int)local_84)) ||
           ((local_84 == uVar6 && ((int)uVar5 < (int)local_88)))) {
          local_8c = iVar;
          local_88 = uVar5;
          local_84 = uVar6;
        }
      }
    }
    for (lVar3 = 0; (ulong)(uint)nTruths << 3 != lVar3; lVar3 = lVar3 + 8) {
      Kit_TruthCofactor0New
                (*(uint **)((long)ppCofs + lVar3 * 2),*(uint **)((long)ppTruths + lVar3),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_8c);
      Kit_TruthCofactor1New
                (*(uint **)((long)ppCofs + lVar3 * 2 + 8),*(uint **)((long)ppTruths + lVar3),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_8c);
    }
    return local_8c;
  }
  __assert_fail("nTruths > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                ,0x36,
                "int Lpk_FunComputeMinSuppSizeVar(Lpk_Fun_t *, unsigned int **, int, unsigned int **, unsigned int)"
               );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cofactors TTs w.r.t. all vars and finds the best var.]

  Description [The best variable is the variable with the minimum 
  sum total of the support sizes of all truth tables. This procedure 
  computes and returns cofactors w.r.t. the best variable.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_FunComputeMinSuppSizeVar( Lpk_Fun_t * p, unsigned ** ppTruths, int nTruths, unsigned ** ppCofs, unsigned uNonDecSupp )
{
    int i, Var, VarBest, nSuppSize0, nSuppSize1;
    int nSuppTotalMin = -1; // Suppress "might be used uninitialized"
    int nSuppTotalCur;
    int nSuppMaxMin = -1; // Suppress "might be used uninitialized"
    int nSuppMaxCur;
    assert( nTruths > 0 );
    VarBest = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        if ( (uNonDecSupp & (1 << Var)) == 0 )
            continue;
        nSuppMaxCur = 0;
        nSuppTotalCur = 0;
        for ( i = 0; i < nTruths; i++ )
        {
            if ( nTruths == 1 )
            {
                nSuppSize0 = Kit_WordCountOnes( p->puSupps[2*Var+0] );
                nSuppSize1 = Kit_WordCountOnes( p->puSupps[2*Var+1] );
            }
            else
            {
                Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, Var );
                Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, Var );
                nSuppSize0 = Kit_TruthSupportSize( ppCofs[2*i+0], p->nVars );
                nSuppSize1 = Kit_TruthSupportSize( ppCofs[2*i+1], p->nVars );
            }        
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize0 );
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize1 );
            nSuppTotalCur += nSuppSize0 + nSuppSize1;
        }
        if ( VarBest == -1 || nSuppMaxMin > nSuppMaxCur ||
             (nSuppMaxMin == nSuppMaxCur && nSuppTotalMin > nSuppTotalCur) )
        {
            VarBest = Var;
            nSuppMaxMin = nSuppMaxCur;
            nSuppTotalMin = nSuppTotalCur;
        }
    }
    // recompute cofactors for the best var
    for ( i = 0; i < nTruths; i++ )
    {
        Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, VarBest );
        Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, VarBest );
    }
    return VarBest;
}